

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite_orm.h
# Opt level: O1

sync_schema_result __thiscall
sqlite_orm::internal::storage_impl<$96322bb6$>::schema_status
          (storage_impl<_96322bb6_> *this,sqlite3 *db,bool preserve)

{
  table_type *this_00;
  pointer pptVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  sync_schema_result sVar5;
  sync_schema_result sVar6;
  pointer pptVar7;
  sync_schema_result sVar8;
  vector<sqlite_orm::table_info_*,_std::allocator<sqlite_orm::table_info_*>_> columnsToAdd;
  vector<sqlite_orm::table_info,_std::allocator<sqlite_orm::table_info>_> dbTableInfo;
  vector<sqlite_orm::table_info,_std::allocator<sqlite_orm::table_info>_> storageTableInfo;
  vector<sqlite_orm::table_info_*,_std::allocator<sqlite_orm::table_info_*>_> local_78;
  vector<sqlite_orm::table_info,_std::allocator<sqlite_orm::table_info>_> local_60;
  vector<sqlite_orm::table_info,_std::allocator<sqlite_orm::table_info>_> local_48;
  
  this_00 = &this->table;
  bVar2 = storage_impl_base::table_exists((storage_impl_base *)this,(string *)this_00,db);
  sVar6 = new_table_created;
  bVar2 = !bVar2;
  if (!bVar2) {
    table_t<relive::Url,_sqlite_orm::internal::column_t<relive::Url,_long,_const_long_&(relive::Url::*)()_const,_void_(relive::Url::*)(long),_sqlite_orm::constraints::autoincrement_t,_sqlite_orm::constraints::primary_key_t<>_>,_sqlite_orm::internal::column_t<relive::Url,_long,_const_long_&(relive::Url::*)()_const,_void_(relive::Url::*)(long)>,_sqlite_orm::internal::column_t<relive::Url,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&(relive::Url::*)()_const,_void_(relive::Url::*)(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>,_sqlite_orm::internal::column_t<relive::Url,_long,_const_long_&(relive::Url::*)()_const,_void_(relive::Url::*)(long)>,_sqlite_orm::internal::column_t<relive::Url,_int,_const_int_&(relive::Url::*)()_const,_void_(relive::Url::*)(int)>,_sqlite_orm::internal::column_t<relive::Url,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&(relive::Url::*)()_const,_void_(relive::Url::*)(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>
    ::get_table_info(&local_48,this_00);
    storage_impl_base::get_table_info(&local_60,(storage_impl_base *)this,(string *)this_00,db);
    local_78.super__Vector_base<sqlite_orm::table_info_*,_std::allocator<sqlite_orm::table_info_*>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_78.super__Vector_base<sqlite_orm::table_info_*,_std::allocator<sqlite_orm::table_info_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_78.super__Vector_base<sqlite_orm::table_info_*,_std::allocator<sqlite_orm::table_info_*>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    bVar3 = storage_impl_base::get_remove_add_columns(&local_78,&local_48,&local_60);
    bVar4 = bVar3 || bVar2;
    sVar8 = already_in_sync;
    sVar5 = new_columns_added;
    if ((!bVar3 && !bVar2) &&
       (local_60.super__Vector_base<sqlite_orm::table_info,_std::allocator<sqlite_orm::table_info>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        local_60.super__Vector_base<sqlite_orm::table_info,_std::allocator<sqlite_orm::table_info>_>
        ._M_impl.super__Vector_impl_data._M_start)) {
      bVar4 = !preserve || bVar4;
      sVar8 = preserve + already_in_sync;
      sVar5 = preserve + new_columns_added;
    }
    sVar6 = dropped_and_recreated;
    if ((!bVar4) &&
       (pptVar1 = local_78.
                  super__Vector_base<sqlite_orm::table_info_*,_std::allocator<sqlite_orm::table_info_*>_>
                  ._M_impl.super__Vector_impl_data._M_start, sVar6 = sVar8,
       local_78.
       super__Vector_base<sqlite_orm::table_info_*,_std::allocator<sqlite_orm::table_info_*>_>.
       _M_impl.super__Vector_impl_data._M_finish !=
       local_78.
       super__Vector_base<sqlite_orm::table_info_*,_std::allocator<sqlite_orm::table_info_*>_>.
       _M_impl.super__Vector_impl_data._M_start)) {
      do {
        pptVar7 = pptVar1 + 1;
        if (((*pptVar1)->notnull == true) && (((*pptVar1)->dflt_value)._M_string_length == 0)) {
          bVar4 = true;
          bVar2 = true;
        }
        else {
          bVar2 = false;
        }
      } while ((!bVar2) &&
              (pptVar1 = pptVar7,
              pptVar7 !=
              local_78.
              super__Vector_base<sqlite_orm::table_info_*,_std::allocator<sqlite_orm::table_info_*>_>
              ._M_impl.super__Vector_impl_data._M_finish));
      sVar6 = sVar5;
      if (bVar4) {
        sVar6 = dropped_and_recreated;
      }
    }
    if (local_78.
        super__Vector_base<sqlite_orm::table_info_*,_std::allocator<sqlite_orm::table_info_*>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_78.
                      super__Vector_base<sqlite_orm::table_info_*,_std::allocator<sqlite_orm::table_info_*>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_78.
                            super__Vector_base<sqlite_orm::table_info_*,_std::allocator<sqlite_orm::table_info_*>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_78.
                            super__Vector_base<sqlite_orm::table_info_*,_std::allocator<sqlite_orm::table_info_*>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    std::vector<sqlite_orm::table_info,_std::allocator<sqlite_orm::table_info>_>::~vector(&local_60)
    ;
    std::vector<sqlite_orm::table_info,_std::allocator<sqlite_orm::table_info>_>::~vector(&local_48)
    ;
  }
  return sVar6;
}

Assistant:

sync_schema_result schema_status(sqlite3 *db, bool preserve) const {

        auto res = sync_schema_result::already_in_sync;

        //  first let's see if table with such name exists..
        auto gottaCreateTable = !this->table_exists(this->table.name, db);
        if(!gottaCreateTable) {

            //  get table info provided in `make_table` call..
            auto storageTableInfo = this->table.get_table_info();

            //  now get current table info from db using `PRAGMA table_info` query..
            auto dbTableInfo = this->get_table_info(this->table.name, db);

            //  this vector will contain pointers to columns that gotta be added..
            std::vector<table_info *> columnsToAdd;

            if(this->get_remove_add_columns(columnsToAdd, storageTableInfo, dbTableInfo)) {
                gottaCreateTable = true;
            }

            if(!gottaCreateTable) {  //  if all storage columns are equal to actual db columns but there are
                //  excess columns at the db..
                if(dbTableInfo.size() > 0) {
                    // extra table columns than storage columns
                    if(!preserve) {
                        gottaCreateTable = true;
                    } else {
                        res = decltype(res)::old_columns_removed;
                    }
                }
            }
            if(gottaCreateTable) {
                res = decltype(res)::dropped_and_recreated;
            } else {
                if(columnsToAdd.size()) {
                    // extra storage columns than table columns
                    for(auto columnPointer: columnsToAdd) {
                        if(columnPointer->notnull && columnPointer->dflt_value.empty()) {
                            gottaCreateTable = true;
                            break;
                        }
                    }
                    if(!gottaCreateTable) {
                        if(res == decltype(res)::old_columns_removed) {
                            res = decltype(res)::new_columns_added_and_old_columns_removed;
                        } else {
                            res = decltype(res)::new_columns_added;
                        }
                    } else {
                        res = decltype(res)::dropped_and_recreated;
                    }
                } else {
                    if(res != decltype(res)::old_columns_removed) {
                        res = decltype(res)::already_in_sync;
                    }
                }
            }
        } else {
            res = decltype(res)::new_table_created;
        }
        return res;
    }